

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ImGuiIO(ImGuiIO *this)

{
  undefined4 *in_RDI;
  int i_3;
  int i_2;
  int i_1;
  int i;
  ImVec2 *local_78;
  ImVec2 *local_58;
  int local_4c;
  int local_48;
  int local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  int local_20;
  ImVec2 local_10 [2];
  
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 2));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2c));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x2e));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x30));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0x4a));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xee));
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 0xf0));
  local_58 = (ImVec2 *)(in_RDI + 0xf2);
  do {
    ImVec2::ImVec2(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (ImVec2 *)(in_RDI + 0xfc));
  local_78 = (ImVec2 *)(in_RDI + 0x115);
  do {
    ImVec2::ImVec2(local_78);
    local_78 = local_78 + 1;
  } while (local_78 != (ImVec2 *)(in_RDI + 0x11f));
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)(in_RDI + 0x54e));
  memset(in_RDI,0,0x1548);
  *in_RDI = 0;
  in_RDI[1] = 0;
  ImVec2::ImVec2(local_10,-1.0,-1.0);
  *(ImVec2 *)(in_RDI + 2) = local_10[0];
  in_RDI[4] = 0x3c888889;
  in_RDI[5] = 0x40a00000;
  *(char **)(in_RDI + 6) = "imgui.ini";
  *(char **)(in_RDI + 8) = "imgui_log.txt";
  in_RDI[10] = 0x3e99999a;
  in_RDI[0xb] = 0x40c00000;
  for (local_20 = 0; local_20 < 0x15; local_20 = local_20 + 1) {
    in_RDI[(long)local_20 + 0xd] = 0xffffffff;
  }
  in_RDI[0x22] = 0x3e800000;
  in_RDI[0x23] = 0x3d4ccccd;
  *(undefined8 *)(in_RDI + 0x24) = 0;
  *(undefined8 *)(in_RDI + 0x26) = 0;
  in_RDI[0x28] = 0x3f800000;
  *(undefined8 *)(in_RDI + 0x2a) = 0;
  *(undefined1 *)(in_RDI + 0x29) = 0;
  ImVec2::ImVec2(&local_28,1.0,1.0);
  *(ImVec2 *)(in_RDI + 0x2c) = local_28;
  ImVec2::ImVec2(&local_30,0.0,0.0);
  *(ImVec2 *)(in_RDI + 0x30) = local_30;
  *(undefined8 *)(in_RDI + 0x2e) = *(undefined8 *)(in_RDI + 0x30);
  *(undefined1 *)((long)in_RDI + 0xc9) = 0;
  *(undefined1 *)((long)in_RDI + 0xca) = 1;
  *(undefined1 *)((long)in_RDI + 0xcb) = 1;
  *(undefined1 *)(in_RDI + 0x33) = 0;
  *(undefined8 *)(in_RDI + 0x36) = 0;
  *(undefined8 *)(in_RDI + 0x34) = 0;
  *(undefined8 *)(in_RDI + 0x3c) = 0;
  *(undefined8 *)(in_RDI + 0x3a) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  *(code **)(in_RDI + 0x3e) = GetClipboardTextFn_DefaultImpl;
  *(code **)(in_RDI + 0x40) = SetClipboardTextFn_DefaultImpl;
  *(undefined8 *)(in_RDI + 0x42) = 0;
  *(code **)(in_RDI + 0x44) = ImeSetInputScreenPosFn_DefaultImpl;
  *(undefined8 *)(in_RDI + 0x46) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  ImVec2::ImVec2(&local_38,-3.4028235e+38,-3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0x4a) = local_38;
  ImVec2::ImVec2(&local_40,-3.4028235e+38,-3.4028235e+38);
  *(ImVec2 *)(in_RDI + 0xf0) = local_40;
  in_RDI[0xc] = 0x40c00000;
  for (local_44 = 0; local_44 < 5; local_44 = local_44 + 1) {
    in_RDI[(long)local_44 + 0x110] = 0xbf800000;
    in_RDI[(long)local_44 + 0x10b] = 0xbf800000;
  }
  for (local_48 = 0; local_48 < 0x200; local_48 = local_48 + 1) {
    in_RDI[(long)local_48 + 0x324] = 0xbf800000;
    in_RDI[(long)local_48 + 0x124] = 0xbf800000;
  }
  for (local_4c = 0; local_4c < 0x15; local_4c = local_4c + 1) {
    in_RDI[(long)local_4c + 0x524] = 0xbf800000;
  }
  return;
}

Assistant:

ImGuiIO::ImGuiIO()
{
    // Most fields are initialized with zero
    memset(this, 0, sizeof(*this));

    // Settings
    ConfigFlags = ImGuiConfigFlags_None;
    BackendFlags = ImGuiBackendFlags_None;
    DisplaySize = ImVec2(-1.0f, -1.0f);
    DeltaTime = 1.0f/60.0f;
    IniSavingRate = 5.0f;
    IniFilename = "imgui.ini";
    LogFilename = "imgui_log.txt";
    MouseDoubleClickTime = 0.30f;
    MouseDoubleClickMaxDist = 6.0f;
    for (int i = 0; i < ImGuiKey_COUNT; i++)
        KeyMap[i] = -1;
    KeyRepeatDelay = 0.250f;
    KeyRepeatRate = 0.050f;
    UserData = NULL;

    Fonts = NULL;
    FontGlobalScale = 1.0f;
    FontDefault = NULL;
    FontAllowUserScaling = false;
    DisplayFramebufferScale = ImVec2(1.0f, 1.0f);
    DisplayVisibleMin = DisplayVisibleMax = ImVec2(0.0f, 0.0f);

    // Miscellaneous configuration options
#ifdef __APPLE__
    ConfigMacOSXBehaviors = true;  // Set Mac OS X style defaults based on __APPLE__ compile time flag
#else
    ConfigMacOSXBehaviors = false;
#endif
    ConfigInputTextCursorBlink = true;
    ConfigWindowsResizeFromEdges = true;
    ConfigWindowsMoveFromTitleBarOnly = false;

    // Platform Functions
    BackendPlatformName = BackendRendererName = NULL;
    BackendPlatformUserData = BackendRendererUserData = BackendLanguageUserData = NULL;
    GetClipboardTextFn = GetClipboardTextFn_DefaultImpl;   // Platform dependent default implementations
    SetClipboardTextFn = SetClipboardTextFn_DefaultImpl;
    ClipboardUserData = NULL;
    ImeSetInputScreenPosFn = ImeSetInputScreenPosFn_DefaultImpl;
    ImeWindowHandle = NULL;

#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
    RenderDrawListsFn = NULL;
#endif

    // Input (NB: we already have memset zero the entire structure!)
    MousePos = ImVec2(-FLT_MAX, -FLT_MAX);
    MousePosPrev = ImVec2(-FLT_MAX, -FLT_MAX);
    MouseDragThreshold = 6.0f;
    for (int i = 0; i < IM_ARRAYSIZE(MouseDownDuration); i++) MouseDownDuration[i] = MouseDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(KeysDownDuration); i++) KeysDownDuration[i]  = KeysDownDurationPrev[i] = -1.0f;
    for (int i = 0; i < IM_ARRAYSIZE(NavInputsDownDuration); i++) NavInputsDownDuration[i] = -1.0f;
}